

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::processAttributeGroupRef
          (TraverseSchema *this,DOMElement *elem,XMLCh *refName,ComplexTypeInfo *typeInfo)

{
  XMLBuffer *this_00;
  SchemaInfo **enclosingSchema;
  short *psVar1;
  XMLCh XVar2;
  SchemaInfo *pSVar3;
  XSAnnotation *pXVar4;
  XMLStringPool *pXVar5;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar6;
  ValueVectorOf<int> *pVVar7;
  SchemaInfo *pSVar8;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar9;
  DOMElement **ppDVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ListType aListType;
  DOMElement *pDVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *text1;
  ulong uVar15;
  XercesAttGroupInfo *pXVar16;
  SchemaInfo *toRestore;
  XercesAttGroupInfo *fromAttGroup;
  XMLCh *pXVar17;
  XMLSize_t XVar18;
  XMLCh *pXVar19;
  XMLSize_t getAt;
  XMLCh XVar20;
  ulong uVar21;
  ulong uVar22;
  RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *pRVar23;
  XMLCh *name;
  bool bVar24;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar3 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar3;
  pDVar14 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar14 = checkContent(this,elem,pDVar14,true,true);
  if (pDVar14 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x1f,L"attributeGroup"
                      ,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  pXVar4 = this->fAnnotation;
  iVar12 = XMLString::indexOf(refName,L':');
  if (iVar12 + 1U < 2) {
    pXVar19 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,refName,(long)iVar12);
    pXVar5 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
    iVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar13);
    pXVar19 = (XMLCh *)CONCAT44(extraout_var,iVar12);
  }
  iVar12 = XMLString::indexOf(refName,L':');
  XVar18 = 0;
  if (refName != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)refName + XVar18);
      XVar18 = XVar18 + 2;
    } while (*psVar1 != 0);
    XVar18 = ((long)XVar18 >> 1) - 1;
  }
  if (XVar18 == (long)(iVar12 + 1)) {
    name = L"";
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar12 == -1) {
      this_00->fIndex = 0;
      XMLBuffer::append(this_00,refName,XVar18);
    }
    else {
      this_00->fIndex = 0;
      XMLBuffer::append(this_00,refName + (long)iVar12 + 1,XVar18 + ~(long)iVar12);
    }
    pXVar5 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
    iVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar13);
    name = (XMLCh *)CONCAT44(extraout_var_00,iVar12);
  }
  text1 = resolvePrefixToURI(this,elem,pXVar19);
  pSVar3 = this->fSchemaInfo;
  uVar13 = this->fCurrentScope;
  pXVar19 = this->fTargetNSURIString;
  if (text1 == pXVar19) {
LAB_00334580:
    pRVar6 = this->fAttGroupRegistry;
    if ((name == (XMLCh *)0x0) || (uVar15 = (ulong)(ushort)*name, uVar15 == 0)) {
      uVar15 = 0;
    }
    else {
      XVar20 = name[1];
      if (XVar20 != L'\0') {
        pXVar19 = name + 2;
        do {
          uVar15 = (ulong)(ushort)XVar20 + (uVar15 >> 0x18) + uVar15 * 0x26;
          XVar20 = *pXVar19;
          pXVar19 = pXVar19 + 1;
        } while (XVar20 != L'\0');
      }
      uVar15 = uVar15 % pRVar6->fHashModulus;
    }
    pRVar23 = pRVar6->fBucketList[uVar15];
    if (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0) {
      do {
        bVar24 = StringHasher::equals((StringHasher *)&pRVar6->field_0x30,name,pRVar23->fKey);
        if (bVar24) goto LAB_00334657;
        pRVar23 = pRVar23->fNext;
      } while (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0);
    }
    pRVar23 = (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0;
LAB_00334657:
    aListType = INCLUDE;
    if (pRVar23 == (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0) {
      fromAttGroup = (XercesAttGroupInfo *)0x0;
    }
    else {
      fromAttGroup = pRVar23->fData;
    }
  }
  else {
    pXVar17 = text1;
    if (pXVar19 == (XMLCh *)0x0 || text1 == (XMLCh *)0x0) {
      if (text1 == (XMLCh *)0x0) {
        if (pXVar19 == (XMLCh *)0x0) goto LAB_00334580;
LAB_00334575:
        bVar24 = *pXVar19 == L'\0';
      }
      else {
        bVar24 = *text1 == L'\0';
        if ((pXVar19 != (XMLCh *)0x0) && (*text1 == L'\0')) goto LAB_00334575;
      }
      if (bVar24) goto LAB_00334580;
    }
    else {
      do {
        XVar20 = *pXVar17;
        if (XVar20 == L'\0') goto LAB_00334575;
        XVar2 = *pXVar19;
        pXVar19 = pXVar19 + 1;
        pXVar17 = pXVar17 + 1;
      } while (XVar20 == XVar2);
    }
    iVar12 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                       (this->fURIStringPool,text1);
    pVVar7 = this->fImportedNSList;
    if (pVVar7 == (ValueVectorOf<int> *)0x0) {
LAB_003346a8:
      fromAttGroup = (XercesAttGroupInfo *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,text1,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      aListType = INCLUDE;
      bVar24 = false;
    }
    else {
      uVar15 = pVVar7->fCurCount;
      bVar24 = uVar15 != 0;
      if (uVar15 == 0) {
LAB_0033467b:
        if (!bVar24) goto LAB_003346a8;
      }
      else if (*pVVar7->fElemList != iVar12) {
        uVar21 = 0;
        do {
          uVar22 = uVar15;
          if (uVar15 - 1 == uVar21) break;
          uVar22 = uVar21 + 1;
          lVar11 = uVar21 + 1;
          uVar21 = uVar22;
        } while (pVVar7->fElemList[lVar11] != iVar12);
        bVar24 = uVar22 < uVar15;
        goto LAB_0033467b;
      }
      pXVar16 = traverseAttributeGroupDeclNS(this,elem,text1,name);
      if (pXVar16 == (XercesAttGroupInfo *)0x0) {
        pSVar8 = this->fSchemaInfo;
        iVar12 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                           (this->fURIStringPool,text1);
        pRVar9 = pSVar8->fImportedInfoList;
        if (pRVar9 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
          XVar18 = 0;
        }
        else {
          XVar18 = (pRVar9->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
        }
        if (XVar18 != 0) {
          getAt = 0;
          do {
            toRestore = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                  (&pSVar8->fImportedInfoList->
                                    super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
            if (toRestore->fTargetNSURI == iVar12) goto LAB_0033473d;
            getAt = getAt + 1;
          } while (XVar18 != getAt);
        }
        toRestore = (SchemaInfo *)0x0;
LAB_0033473d:
        if ((toRestore == (SchemaInfo *)0x0) || (toRestore->fProcessed == true)) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x67,
                            L"attributeGroup",text1,name,(XMLCh *)0x0);
          aListType = INCLUDE;
          bVar24 = false;
        }
        else {
          bVar24 = true;
          restoreSchemaInfo(this,toRestore,IMPORT,0xfffffffe);
          aListType = IMPORT;
        }
        fromAttGroup = (XercesAttGroupInfo *)0x0;
        if (bVar24) {
          fromAttGroup = pXVar16;
        }
      }
      else {
        bVar24 = true;
        aListType = INCLUDE;
        fromAttGroup = pXVar16;
      }
    }
    if (!bVar24) {
      fromAttGroup = (XercesAttGroupInfo *)0x0;
      goto LAB_00334949;
    }
  }
  enclosingSchema = &this->fSchemaInfo;
  if (fromAttGroup == (XercesAttGroupInfo *)0x0) {
    pDVar14 = SchemaInfo::getTopLevelComponent
                        (*enclosingSchema,4,L"attributeGroup",name,enclosingSchema);
    if (pDVar14 == (DOMElement *)0x0) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x67,L"attributeGroup"
                        ,text1,name,(XMLCh *)0x0);
      fromAttGroup = (XercesAttGroupInfo *)0x0;
    }
    else {
      uVar15 = this->fDeclStack->fCurCount;
      bVar24 = uVar15 != 0;
      if (uVar15 == 0) {
LAB_0033487b:
        if (!bVar24) {
          fromAttGroup = traverseAttributeGroupDecl(this,pDVar14,typeInfo,true);
          if ((fromAttGroup != (XercesAttGroupInfo *)0x0) &&
             (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0)) {
            copyAttGroupAttributes
                      (this,elem,fromAttGroup,this->fCurrentAttGroupInfo,(ComplexTypeInfo *)0x0);
          }
          if (pSVar3 != *enclosingSchema) {
            restoreSchemaInfo(this,pSVar3,aListType,uVar13);
          }
          goto LAB_0033493b;
        }
      }
      else {
        ppDVar10 = this->fDeclStack->fElemList;
        if (*ppDVar10 != pDVar14) {
          uVar21 = 1;
          do {
            uVar22 = uVar21;
            if (uVar15 == uVar22) break;
            uVar21 = uVar22 + 1;
          } while (ppDVar10[uVar22] != pDVar14);
          bVar24 = uVar22 < uVar15;
          goto LAB_0033487b;
        }
      }
      fromAttGroup = (XercesAttGroupInfo *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x56,refName,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
LAB_0033493b:
    if (pDVar14 != (DOMElement *)0x0) goto LAB_00334949;
  }
  if (fromAttGroup != (XercesAttGroupInfo *)0x0) {
    copyAttGroupAttributes(this,elem,fromAttGroup,this->fCurrentAttGroupInfo,typeInfo);
  }
  if (pSVar3 != *enclosingSchema) {
    restoreSchemaInfo(this,pSVar3,aListType,0xfffffffe);
  }
LAB_00334949:
  if (pXVar4 != (XSAnnotation *)0x0) {
    (*(pXVar4->super_XSerializable)._vptr_XSerializable[1])(pXVar4);
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return fromAttGroup;
}

Assistant:

XercesAttGroupInfo*
TraverseSchema::processAttributeGroupRef(const DOMElement* const elem,
                                         const XMLCh* const refName,
                                         ComplexTypeInfo* const typeInfo) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0) {
        reportSchemaError(elem ,XMLUni::fgValidityDomain, XMLValid::NoContentForRef, SchemaSymbols::fgELT_ATTRIBUTEGROUP);
    }

    Janitor<XSAnnotation> janAnnot(fAnnotation);
    const                XMLCh* prefix = getPrefix(refName);
    const                XMLCh* localPart = getLocalPart(refName);
    const                XMLCh* uriStr = resolvePrefixToURI(elem, prefix);
    XercesAttGroupInfo*  attGroupInfo = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return 0;
        }

        attGroupInfo = traverseAttributeGroupDeclNS(elem, uriStr, localPart);

        if (!attGroupInfo) {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(fURIStringPool->addOrFind(uriStr));

            if (!impInfo || impInfo->getProcessed()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNotFound,
                                  SchemaSymbols::fgELT_ATTRIBUTEGROUP, uriStr, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }
    else {

        attGroupInfo = fAttGroupRegistry->get(localPart);
    }

    if (!attGroupInfo) {

        // traverse top level attributeGroup - if found
        DOMElement* attGroupElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_AttributeGroup,
            SchemaSymbols::fgELT_ATTRIBUTEGROUP, localPart, &fSchemaInfo);

        if (attGroupElem != 0) {

            // circular attribute check
            if (fDeclStack->containsElement(attGroupElem)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoCircularDefinition, refName);
                return 0;
            }

            attGroupInfo = traverseAttributeGroupDecl(attGroupElem, typeInfo, true);

            if (attGroupInfo && fCurrentAttGroupInfo) {
                copyAttGroupAttributes(elem, attGroupInfo, fCurrentAttGroupInfo, 0);
            }

            // restore schema information, if necessary
            if (saveInfo != fSchemaInfo) {
                restoreSchemaInfo(saveInfo, infoType, saveScope);
            }

            return attGroupInfo;
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNotFound,
                              SchemaSymbols::fgELT_ATTRIBUTEGROUP, uriStr, localPart);
        }
    }

    if (attGroupInfo) {
        copyAttGroupAttributes(elem, attGroupInfo, fCurrentAttGroupInfo, typeInfo);
    }

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType);
    }

    return attGroupInfo;
}